

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O3

void phosg::strip_trailing_whitespace<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  size_type sVar1;
  ulong uVar2;
  
  sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(s," \t\r\n",0xffffffffffffffff,4);
  if (sVar1 == 0xffffffffffffffff) {
    if (((s->_M_string_length == 0) || (uVar2 = (ulong)(byte)*(s->_M_dataplus)._M_p, 0x20 < uVar2))
       || ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0)) {
      return;
    }
    sVar1 = 0;
  }
  else {
    sVar1 = sVar1 + 1;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (s,sVar1,'\0');
  return;
}

Assistant:

void strip_trailing_whitespace(StrT& s) {
  size_t index = s.find_last_not_of(" \t\r\n");
  if (index != StrT::npos) {
    s.resize(index + 1);
  } else if (!s.empty() &&
      ((s[0] == ' ') || (s[0] == '\t') || (s[0] == '\r') || (s[0] == '\n'))) {
    s.resize(0); // String is entirely whitespace
  }
}